

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool writeJsonFiles(QList<QString> *fileList,QString *fileListFilePath,QString *timestampFilePath)

{
  bool bVar1;
  uint uVar2;
  QFlags<QIODeviceBase::OpenModeFlag> QVar3;
  char *pcVar4;
  qint64 qVar5;
  QIODevice *__n;
  const_iterator o;
  QString *this;
  size_t in_RCX;
  int __oflag;
  int __oflag_00;
  QString *in_RDX;
  QString *in_RSI;
  long in_FS_OFFSET;
  QString *jsonFile_1;
  QList<QString> *__range2;
  qint64 jsonFileLastModified;
  QString *jsonFile;
  QList<QString> *__range1;
  const_iterator __end2;
  const_iterator __begin2;
  QTextStream textStream;
  QFile file;
  const_iterator __end1;
  const_iterator __begin1;
  qint64 timestamp;
  QFile timestampFile;
  undefined4 in_stack_fffffffffffffec8;
  Initialization in_stack_fffffffffffffecc;
  QList<QString> *in_stack_fffffffffffffed0;
  FILE *pFVar6;
  QString *in_stack_fffffffffffffed8;
  QIODevice *device;
  QIODevice *in_stack_fffffffffffffee0;
  QString *in_stack_fffffffffffffee8;
  QDateTime *in_stack_fffffffffffffef8;
  byte local_b9;
  const_iterator local_a8;
  undefined8 local_a0;
  QFile local_80 [2];
  QString *local_58;
  const_iterator local_50;
  const_iterator local_48;
  QIODevice *local_40 [4];
  uint local_1c;
  QIODevice local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18._vptr_QIODevice = (_func_int **)0xaaaaaaaaaaaaaaaa;
  local_18.d_ptr._M_t.
  super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
  super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
  super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl =
       (__uniq_ptr_data<QIODevicePrivate,_std::default_delete<QIODevicePrivate>,_true,_true>)
       (__uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>)0xaaaaaaaaaaaaaaaa
  ;
  QFile::QFile((QFile *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffed0,
             in_stack_fffffffffffffecc);
  uVar2 = QFile::open((QFile *)&local_18,(char *)(ulong)local_1c,__oflag);
  if ((uVar2 & 1) == 0) {
    pFVar6 = _stderr;
    QtPrivate::asString(in_RDX);
    QString::toLocal8Bit((QString *)pFVar6);
    pcVar4 = QByteArray::constData((QByteArray *)0x1090d7);
    fprintf(pFVar6,"Could not open: %s\n",pcVar4);
    QByteArray::~QByteArray((QByteArray *)0x1090fa);
    local_b9 = 0;
  }
  else {
    local_40[0] = (QIODevice *)std::numeric_limits<long_long>::min();
    qVar5 = QFile::size((QFile *)0x109126);
    if (qVar5 == 8) {
      QIODevice::read(&local_18,(int)local_40,(void *)0x8,in_RCX);
    }
    local_48.i = (QString *)0xaaaaaaaaaaaaaaaa;
    local_48 = QList<QString>::begin(in_stack_fffffffffffffed0);
    local_50.i = (QString *)0xaaaaaaaaaaaaaaaa;
    local_50 = QList<QString>::end(in_stack_fffffffffffffed0);
    while( true ) {
      local_58 = local_50.i;
      bVar1 = QList<QString>::const_iterator::operator!=(&local_48,local_50);
      if (!bVar1) break;
      QList<QString>::const_iterator::operator*(&local_48);
      QFileInfo::QFileInfo((QFileInfo *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      QTimeZone::QTimeZone((QTimeZone *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
      QFileInfo::lastModified
                ((QFileInfo *)in_stack_fffffffffffffed8,(QTimeZone *)in_stack_fffffffffffffed0);
      in_stack_fffffffffffffee0 =
           (QIODevice *)QDateTime::toMSecsSinceEpoch(in_stack_fffffffffffffef8);
      QDateTime::~QDateTime((QDateTime *)0x109250);
      QTimeZone::~QTimeZone((QTimeZone *)0x10925d);
      QFileInfo::~QFileInfo((QFileInfo *)0x10926a);
      if ((long)local_40[0] < (long)in_stack_fffffffffffffee0) {
        local_40[0] = in_stack_fffffffffffffee0;
      }
      QList<QString>::const_iterator::operator++(&local_48);
    }
    device = local_40[0];
    __n = (QIODevice *)std::numeric_limits<long_long>::min();
    if ((device != __n) || (bVar1 = QFile::exists((QString *)0x1092cd), !bVar1)) {
      local_80[0].super_QFileDevice.super_QIODevice._vptr_QIODevice =
           (_func_int **)0xaaaaaaaaaaaaaaaa;
      local_80[0].super_QFileDevice.super_QIODevice.d_ptr._M_t.
      super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
      super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
      super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl =
           (__uniq_ptr_data<QIODevicePrivate,_std::default_delete<QIODevicePrivate>,_true,_true>)
           (__uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>)
           0xaaaaaaaaaaaaaaaa;
      QFile::QFile((QFile *)in_stack_fffffffffffffee0,(QString *)device);
      QVar3 = operator|((enum_type)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                        (enum_type)in_stack_fffffffffffffed0);
      uVar2 = QFile::open(local_80,(char *)(ulong)(uint)QVar3.
                                                  super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>
                                                  .super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.
                                                  i,__oflag_00);
      if ((uVar2 & 1) == 0) {
        pFVar6 = _stderr;
        QtPrivate::asString(in_RSI);
        QString::toLocal8Bit(in_stack_fffffffffffffee8);
        pcVar4 = QByteArray::constData((QByteArray *)0x109363);
        fprintf(pFVar6,"Could not open: %s\n",pcVar4);
        QByteArray::~QByteArray((QByteArray *)0x109386);
        local_b9 = 0;
        bVar1 = true;
      }
      else {
        local_a0 = 0xaaaaaaaaaaaaaaaa;
        QTextStream::QTextStream((QTextStream *)in_stack_fffffffffffffee0,device);
        local_a8.i = (QString *)0xaaaaaaaaaaaaaaaa;
        local_a8 = QList<QString>::begin(in_stack_fffffffffffffed0);
        o = QList<QString>::end(in_stack_fffffffffffffed0);
        while (bVar1 = QList<QString>::const_iterator::operator!=(&local_a8,o), bVar1) {
          this = QList<QString>::const_iterator::operator*(&local_a8);
          QTextStream::operator<<((QTextStream *)this,in_stack_fffffffffffffee8);
          operator<<((QTextStream *)in_stack_fffffffffffffed0,
                     (QTextStreamFunction)
                     CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          QList<QString>::const_iterator::operator++(&local_a8);
        }
        QTextStream::flush((QTextStream *)in_stack_fffffffffffffed0);
        QFile::resize((QFile *)in_stack_fffffffffffffed0,
                      CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        QIODevice::write(&local_18,(int)local_40,(void *)0x8,(size_t)__n);
        QTextStream::~QTextStream((QTextStream *)in_stack_fffffffffffffed0);
        bVar1 = false;
      }
      QFile::~QFile((QFile *)0x1094ed);
      if (bVar1) goto LAB_00109506;
    }
    local_b9 = 1;
  }
LAB_00109506:
  QFile::~QFile((QFile *)0x109513);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_b9 & 1);
}

Assistant:

static bool writeJsonFiles(const QList<QString> &fileList, const QString &fileListFilePath,
                           const QString &timestampFilePath)
{
    QFile timestampFile(timestampFilePath);
    if (!timestampFile.open(QIODevice::ReadWrite)) {
        fprintf(stderr, "Could not open: %s\n", qPrintable(timestampFilePath));
        return false;
    }

    qint64 timestamp = std::numeric_limits<qint64>::min();
    if (timestampFile.size() == sizeof(timestamp))
        timestampFile.read(reinterpret_cast<char *>(&timestamp), sizeof(timestamp));

    // Check if any of the metatype json files produced by automoc is newer than the last file
    // processed by cmake_automoc parser
    for (const auto &jsonFile : fileList) {
        const qint64 jsonFileLastModified =
                QFileInfo(jsonFile).lastModified(QTimeZone::UTC).toMSecsSinceEpoch();
        if (jsonFileLastModified > timestamp) {
            timestamp = jsonFileLastModified;
        }
    }

    if (timestamp != std::numeric_limits<qint64>::min() || !QFile::exists(fileListFilePath)) {
        QFile file(fileListFilePath);
        if (!file.open(QIODevice::WriteOnly | QIODevice::Text)) {
            fprintf(stderr, "Could not open: %s\n", qPrintable(fileListFilePath));
            return false;
        }

        QTextStream textStream(&file);
        for (const auto &jsonFile : fileList) {
            textStream << jsonFile << Qt::endl;
        }
        textStream.flush();

        // Update the timestamp according the newest json file timestamp.
        timestampFile.resize(0);
        timestampFile.write(reinterpret_cast<char *>(&timestamp), sizeof(timestamp));
    }
    return true;
}